

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O0

int cvt2triphone(acmod_set_t *acmod_set,acmod_id_t *phone,char *btw_mark,uint32 n_phone)

{
  uint uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  acmod_id_t aVar4;
  uint32 uVar5;
  acmod_id_t aVar6;
  word_posn_t posn_00;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  word_posn_t local_4c;
  int j;
  char *word_posn_map;
  acmod_id_t sil;
  word_posn_t posn;
  acmod_id_t tri_id;
  ci_acmod_id_t r;
  ci_acmod_id_t l;
  ci_acmod_id_t b;
  uint32 i;
  uint32 n_phone_local;
  char *btw_mark_local;
  acmod_id_t *phone_local;
  acmod_set_t *acmod_set_local;
  
  aVar4 = acmod_set_name2id(acmod_set,"SIL");
  uVar5 = acmod_set_n_multi(acmod_set);
  if (uVar5 == 0) {
    if (cvt2triphone::spoke_my_peace == 0) {
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,199,"no multiphones defined, no conversion done\n");
      cvt2triphone::spoke_my_peace = 1;
      fflush(_stderr);
    }
  }
  else {
    uVar2 = (undefined1)aVar4;
    word_posn_map._4_4_ = WORD_POSN_END;
    posn._2_1_ = uVar2;
    for (tri_id = 0; tri_id < n_phone - 1; tri_id = tri_id + 1) {
      uVar1 = phone[tri_id + 1];
      uVar5 = acmod_set_has_attrib(acmod_set,uVar1 & 0xff,"filler");
      posn._1_1_ = (char)uVar1;
      if (uVar5 != 0) {
        posn._1_1_ = uVar2;
      }
      uVar1 = phone[tri_id];
      uVar3 = (undefined1)uVar1;
      word_posn_map._4_4_ = btw_posn(btw_mark[tri_id],word_posn_map._4_4_);
      uVar5 = acmod_set_has_attrib(acmod_set,uVar1 & 0xff,"filler");
      posn._3_1_ = uVar2;
      if (uVar5 == 0) {
        aVar6 = acmod_set_tri2id(acmod_set,uVar1 & 0xff,(uint)(byte)posn._2_1_,
                                 (uint)(byte)posn._1_1_,word_posn_map._4_4_);
        posn._3_1_ = uVar3;
        if (aVar6 == 0xffffffff) {
          for (local_4c = WORD_POSN_BEGIN; (int)local_4c < 4; local_4c = local_4c + WORD_POSN_END) {
            aVar6 = acmod_set_tri2id(acmod_set,uVar1 & 0xff,(uint)(byte)posn._2_1_,
                                     (uint)(byte)posn._1_1_,local_4c);
            if (aVar6 != 0xffffffff) {
              phone[tri_id] = aVar6;
              break;
            }
          }
        }
        else {
          phone[tri_id] = aVar6;
        }
      }
      posn._2_1_ = posn._3_1_;
    }
    uVar1 = phone[tri_id];
    uVar5 = acmod_set_has_attrib(acmod_set,uVar1 & 0xff,"filler");
    if (uVar5 == 0) {
      if (tri_id != 0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x10b,"utt does not end with filler phone\n");
      }
      if (btw_mark[tri_id] == '\0') {
        __assert_fail("btw_mark[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                      ,0x110,"int cvt2triphone(acmod_set_t *, acmod_id_t *, char *, uint32)");
      }
      posn_00 = btw_posn(btw_mark[tri_id],word_posn_map._4_4_);
      aVar6 = acmod_set_tri2id(acmod_set,uVar1 & 0xff,(uint)(byte)posn._2_1_,aVar4 & 0xff,posn_00);
      if (aVar6 == 0xffffffff) {
        pcVar7 = acmod_set_id2name(acmod_set,uVar1 & 0xff);
        pcVar8 = acmod_set_id2name(acmod_set,(uint)(byte)posn._2_1_);
        pcVar9 = acmod_set_id2name(acmod_set,aVar4 & 0xff);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x11d,"Missing triphone, (%s %s %s %c), left as CI phone",pcVar7,pcVar8,pcVar9,
                (int)"besiu"[(int)posn_00]);
      }
      else {
        phone[tri_id] = aVar6;
      }
    }
  }
  return 0;
}

Assistant:

int
cvt2triphone(acmod_set_t *acmod_set,
	     acmod_id_t *phone,
	     char *btw_mark,
	     uint32 n_phone)
{
    uint32 i;
    ci_acmod_id_t b = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t l = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t r = (ci_acmod_id_t)NO_ACMOD;
    acmod_id_t tri_id;
    word_posn_t posn;
    static int spoke_my_peace = FALSE;
    acmod_id_t sil = acmod_set_name2id(acmod_set, "SIL");
    char *word_posn_map = WORD_POSN_CHAR_MAP;

    if (acmod_set_n_multi(acmod_set) == 0) {
	/* nothing to do */

	if (!spoke_my_peace) {
	    fflush(stdout);
	    E_INFO("no multiphones defined, no conversion done\n");
	    spoke_my_peace = TRUE;
	    fflush(stderr);
	}
	return S3_SUCCESS;
    }

    for (i = 0, l = r = sil, posn = WORD_POSN_END; i < n_phone-1; i++) {
	/* get new right context */
	r = phone[i+1];
	if (acmod_set_has_attrib(acmod_set, r, "filler"))
	    r = sil;
	
	b = phone[i];

	/* determine between word position {begin|start|single} */
	posn = btw_posn(btw_mark[i], posn);
	
	if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	    tri_id = acmod_set_tri2id(acmod_set,
				      b, l, r, posn);
	    if (tri_id != NO_ACMOD) {
		/* got good triphone, so replace CI w/ tri */
		phone[i] = tri_id;
	    }
	    else {
		    /* Try to back off to other word positions */
		    int j;

		    for (j = 0; j < N_WORD_POSN; ++j) {
			    tri_id = acmod_set_tri2id(acmod_set,
						      b, l, r, j);
			    if (tri_id != NO_ACMOD) {
				    phone[i] = tri_id;
				    break;
			    }
		    }
		    if (j == N_WORD_POSN) {
#if 0
			    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone\n",
				   acmod_set_id2name(acmod_set, b),
				   acmod_set_id2name(acmod_set, l),
				   acmod_set_id2name(acmod_set, r),
				   word_posn_map[(int)posn]);
#endif
		    }
	    }
	}
	else {
	    /* phone[i] is a filler phone, so just leave it as is */
	    /* Change b to SIL for triphone context purposes */
	    b = sil;
	}

	/* Set next left context is the current base phone (where filler phones
	 * are mapped to SIL) */
	l = b;
    }

    b = phone[i];
    r = sil;

    /* At this point, b is the right context of
     * the next to last phone.  Typically, this
     * is sil or some other filler phone. */

    if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	if (i > 0) {
	    E_WARN("utt does not end with filler phone\n");

	    r = sil;
	}
	
	assert( btw_mark[i] );
	
	posn = btw_posn(btw_mark[i], posn);
	
	tri_id = acmod_set_tri2id(acmod_set,
				  b, l, r, posn);
	if (tri_id != NO_ACMOD)
	    phone[i] = tri_id;
	else {
	    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone",
		   acmod_set_id2name(acmod_set, b),
		   acmod_set_id2name(acmod_set, l),
		   acmod_set_id2name(acmod_set, r),
		   word_posn_map[(int)posn]);
	}
    }

    return S3_SUCCESS;
}